

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O2

string * __thiscall
FpgaIO::GetFPGASerialNumber_abi_cxx11_(string *__return_storage_ptr__,FpgaIO *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  char data [20];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  data[0xd] = '\0';
  bVar1 = PromReadData(this,0x1fff00,(uint8_t *)data,0x10);
  if (bVar1) {
    iVar2 = bcmp(data,"FPGA ",5);
    if (iVar2 == 0) {
      pcVar3 = strchr(data + 5,0xff);
      if (pcVar3 != (char *)0x0) {
        *pcVar3 = '\0';
      }
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "FpgaIO::GetFPGASerialNumber: failed to read FPGA Serial Number");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FpgaIO::GetFPGASerialNumber(void)
{
    // Format: FPGA 1234-56 (12 bytes) or FPGA 1234-567 (13 bytes).
    // Note that on PROM, the string is terminated by 0xff because the sector
    // is first erased (all bytes set to 0xff) before the string is written.
    uint32_t address = 0x001FFF00;
    char data[20];
    std::string sn;
    const size_t FPGASNSize = 13;
    const size_t bytesToRead = (FPGASNSize+3)&0xFC;  // must be multiple of 4

    data[FPGASNSize] = 0;    // Make sure null-terminated
    if (PromReadData(address, (uint8_t *)data, bytesToRead)) {
        if (strncmp(data, "FPGA ", 5) == 0) {
            char *p = strchr(data+5, 0xff);
            if (p) *p = 0;      // Null terminate at first 0xff
            sn.assign(data+5);
        }
    }
    else
        std::cerr << "FpgaIO::GetFPGASerialNumber: failed to read FPGA Serial Number" << std::endl;
    return sn;
}